

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int nn_ipc_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  nn_optset *local_38;
  nn_ipc_optset *optset;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  int local_4;
  
  local_38 = self;
  if (self == (nn_optset *)0x0) {
    local_38 = (nn_optset *)0x0;
  }
  if (option == 1) {
    *(nn_optset_vfptr **)optval = local_38[1].vfptr;
    *optvallen = 8;
    local_4 = 0;
  }
  else if (option == 2) {
    *(undefined4 *)optval = *(undefined4 *)&local_38[2].vfptr;
    *optvallen = 4;
    local_4 = 0;
  }
  else if (option == 3) {
    *(undefined4 *)optval = *(undefined4 *)((long)&local_38[2].vfptr + 4);
    *optvallen = 4;
    local_4 = 0;
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

static int nn_ipc_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        memcpy(optval, &optset->sec_attr, sizeof(optset->sec_attr));
        *optvallen = sizeof(optset->sec_attr);
        return 0;
    case NN_IPC_OUTBUFSZ:
        *(int *)optval = optset->outbuffersz;
        *optvallen = sizeof (int);
        return 0;
    case NN_IPC_INBUFSZ:
        *(int *)optval = optset->inbuffersz;
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}